

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

bool __thiscall
VertexAttrib64Bit::LimitTest::testProgramWithDivisor
          (LimitTest *this,_iteration iteration,GLuint program_id,bool use_arrays)

{
  bool bVar1;
  bool bVar2;
  GLenum err;
  
  (*(this->super_Base).gl.useProgram)(program_id);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xb71);
  prepareVertexArray(this,iteration,PER_INSTANCE,program_id,use_arrays);
  bVar1 = testDrawArraysInstanced(this);
  bVar2 = testDrawElementsInstanced(this);
  return bVar2 && bVar1;
}

Assistant:

bool LimitTest::testProgramWithDivisor(_iteration iteration, GLuint program_id, bool use_arrays) const
{
	bool result = true;

	gl.useProgram(program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	prepareVertexArray(iteration, PER_INSTANCE, program_id, use_arrays);

	if (false == testDrawArraysInstanced())
	{
		result = false;
	}

	if (false == testDrawElementsInstanced())
	{
		result = false;
	}

	return result;
}